

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS
ref_node_dratio_dnode0_quadrature
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio,REF_DBL *d_ratio)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_DBL ratio_func;
  REF_DBL ratio_deriv [3];
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  double local_120;
  double local_118;
  double dStack_110;
  double local_108;
  undefined1 local_f8 [16];
  double local_e8;
  REF_DBL local_d8 [6];
  REF_DBL local_a8;
  double adStack_a0 [17];
  
  lVar5 = 0;
  *ratio = 0.0;
  iVar3 = node1 * 0xf;
  d_ratio[2] = 0.0;
  *d_ratio = 0.0;
  d_ratio[1] = 0.0;
  dVar2 = *(double *)(&ref_node->n + (long)iVar3 * 2 + 2) -
          *(double *)(&ref_node->n + (long)(node0 * 0xf) * 2 + 2);
  local_f8._8_4_ = SUB84(dVar2,0);
  local_f8._0_8_ =
       *(double *)(&ref_node->n + (long)iVar3 * 2) -
       *(double *)(&ref_node->n + (long)(node0 * 0xf) * 2);
  local_f8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  local_e8 = (double)(&ref_node->global)[iVar3] - (double)(&ref_node->global)[node0 * 0xf];
  do {
    adStack_a0[lVar5 + 0xb] = *(double *)(&ref_node->n + (long)(node0 * 0xf + 9 + (int)lVar5) * 2);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  lVar5 = 0;
  do {
    adStack_a0[lVar5 + 5] = *(double *)(&ref_node->n + (long)(iVar3 + 9 + (int)lVar5) * 2);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  lVar5 = 0;
  do {
    adStack_a0[lVar5 + -1] = adStack_a0[lVar5 + 0xb] * 0.5 + adStack_a0[lVar5 + 5] * 0.5;
    adStack_a0[lVar5] = adStack_a0[lVar5 + 0xc] * 0.5 + adStack_a0[lVar5 + 6] * 0.5;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  uVar4 = ref_matrix_exp_m(&local_a8,local_d8);
  if (uVar4 == 0) {
    uVar4 = ref_matrix_sqrt_vt_m_v_deriv(local_d8,(REF_DBL *)local_f8,&local_120,&local_118);
    if (uVar4 == 0) {
      *ratio = local_120 + *ratio;
      auVar1._8_4_ = SUB84(d_ratio[1] - dStack_110,0);
      auVar1._0_8_ = *d_ratio - local_118;
      auVar1._12_4_ = (int)((ulong)(d_ratio[1] - dStack_110) >> 0x20);
      *(undefined1 (*) [16])d_ratio = auVar1;
      d_ratio[2] = d_ratio[2] - local_108;
      return 0;
    }
    pcVar7 = "vt m v0";
    uVar6 = 0x5db;
  }
  else {
    pcVar7 = "exp";
    uVar6 = 0x5d9;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
         "ref_node_dratio_dnode0_quadrature",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_node_dratio_dnode0_quadrature(REF_NODE ref_node,
                                                            REF_INT node0,
                                                            REF_INT node1,
                                                            REF_DBL *ratio,
                                                            REF_DBL *d_ratio) {
  REF_DBL mlog0[6], mlog1[6];
  REF_DBL mlog[6], m[6];
  REF_DBL direction[3];
  REF_INT im;
  REF_DBL w0, w1;
  REF_INT i;
  REF_DBL ratio_func, ratio_deriv[3];

  /*
  REF_INT n = 3;
  REF_DBL x[] = {-sqrt(3.0 / 5.0), 0.0, sqrt(3.0 / 5.0)};
  REF_DBL w[] = {5.0 / 9.0, 8.0 / 9.0, 5.0 / 9.0};
  */
  REF_INT n = 1;
  REF_DBL x[] = {0.0};
  REF_DBL w[] = {2.0};

  *ratio = 0.0;
  d_ratio[0] = 0.0;
  d_ratio[1] = 0.0;
  d_ratio[2] = 0.0;

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));
  RSS(ref_node_metric_get_log(ref_node, node0, mlog0), "node0 m");
  RSS(ref_node_metric_get_log(ref_node, node1, mlog1), "node1 m");

  for (i = 0; i < n; i++) {
    w1 = 0.5 * x[i] + 0.5;
    w0 = 1.0 - w1;
    for (im = 0; im < 6; im++) {
      mlog[im] = w0 * mlog0[im] + w1 * mlog1[im];
    }
    RSS(ref_matrix_exp_m(mlog, m), "exp");
    RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio_func, ratio_deriv),
        "vt m v0");
    *ratio += 0.5 * w[i] * ratio_func;
    d_ratio[0] -= 0.5 * w[i] * ratio_deriv[0];
    d_ratio[1] -= 0.5 * w[i] * ratio_deriv[1];
    d_ratio[2] -= 0.5 * w[i] * ratio_deriv[2];
  }

  return REF_SUCCESS;
}